

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void showCountries(vector<Map::Country_*,_std::allocator<Map::Country_*>_> *countries)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this;
  void *this_00;
  string local_a0;
  reference local_80;
  Country **neighbour;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  string local_50;
  reference local_30;
  Country **country;
  iterator __end1;
  iterator __begin1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *countries_local;
  
  __end1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(countries);
  country = (Country **)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(countries)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                *)&country);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
               ::operator*(&__end1);
    poVar3 = std::operator<<((ostream *)&std::cout,"You own: ");
    Map::Country::getCountryName_abi_cxx11_(&local_50,*local_30);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3," with ");
    iVar2 = Map::Country::getNumberOfTroops(*local_30);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," armies.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_50);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tNeighbours: ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this = Map::Country::getAdjCountries(*local_30);
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(this);
    neighbour = (Country **)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                  *)&neighbour);
      if (!bVar1) break;
      local_80 = __gnu_cxx::
                 __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                 ::operator*(&__end2);
      poVar3 = std::operator<<((ostream *)&std::cout,"\t\tName: ");
      Map::Country::getCountryName_abi_cxx11_(&local_a0,*local_80);
      poVar3 = std::operator<<(poVar3,(string *)&local_a0);
      poVar3 = std::operator<<(poVar3," Armies: ");
      iVar2 = Map::Country::getNumberOfTroops(*local_80);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      poVar3 = std::operator<<(poVar3," Owned by: Player ");
      iVar2 = Map::Country::getPlayerOwnerID(*local_80);
      this_00 = (void *)std::ostream::operator<<(poVar3,iVar2);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_a0);
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void showCountries(std::vector<Map::Country *> countries) {
    for (auto &country: countries) {
        std::cout << "You own: " << country->getCountryName() << " with " << country->getNumberOfTroops() << " armies."
                  << std::endl;
        std::cout << "\tNeighbours: " << std::endl;
        for (auto &neighbour: *country->getAdjCountries()) {
            std::cout << "\t\tName: " << neighbour->getCountryName() << " Armies: " << neighbour->getNumberOfTroops()
                      << " Owned by: Player " << neighbour->getPlayerOwnerID() << std::endl;
        }
    }
}